

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

bool __thiscall
JsrtDebugManager::EnableAsyncBreak(JsrtDebugManager *this,ScriptContext *scriptContext)

{
  bool bVar1;
  DebugContext *this_00;
  ProbeContainer *this_01;
  ThreadContext *this_02;
  DebugManager *this_03;
  DebuggingFlags *this_04;
  ProbeContainer *probeContainer;
  ScriptContext *scriptContext_local;
  JsrtDebugManager *this_local;
  
  bVar1 = Js::ScriptContext::IsDebugContextInitialized(scriptContext);
  if (bVar1) {
    this_00 = Js::ScriptContext::GetDebugContext(scriptContext);
    this_01 = Js::DebugContext::GetProbeContainer(this_00);
    bVar1 = Js::ProbeContainer::IsAsyncActivate(this_01);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      Js::ProbeContainer::AsyncActivate(this_01,&this->super_HaltCallback);
      this_02 = Js::ScriptContext::GetThreadContext(scriptContext);
      this_03 = ThreadContext::GetDebugManager(this_02);
      this_04 = Js::DebugManager::GetDebuggingFlags(this_03);
      DebuggingFlags::SetForceInterpreter(this_04,true);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool JsrtDebugManager::EnableAsyncBreak(Js::ScriptContext* scriptContext)
{
    if (!scriptContext->IsDebugContextInitialized())
    {
        // Although the script context exists, it hasn't been fully initialized yet.
        return false;
    }

    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    // This can be called when we are already at break
    if (!probeContainer->IsAsyncActivate())
    {
        probeContainer->AsyncActivate(this);

        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(true);
        return true;
    }
    return false;
}